

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

void __thiscall QCss::StyleSheet::buildIndexes(StyleSheet *this,CaseSensitivity nameCaseSensitivity)

{
  bool bVar1;
  qsizetype qVar2;
  const_reference this_00;
  QMultiHash<QString,_QCss::StyleRule> *this_01;
  const_reference pBVar3;
  int in_ESI;
  QList<QCss::StyleRule> *in_RDI;
  long in_FS_OFFSET;
  BasicSelector *sel;
  Selector *selector;
  int j;
  StyleRule *rule;
  int i;
  QString name;
  QList<QCss::Selector> universalsSelectors;
  QList<QCss::StyleRule> universals;
  StyleRule nr_2;
  StyleRule nr_1;
  StyleRule nr;
  parameter_type in_stack_fffffffffffffe58;
  StyleRule *in_stack_fffffffffffffe60;
  QList<QCss::StyleRule> *in_stack_fffffffffffffe68;
  int local_15c;
  int local_150;
  QList<QCss::StyleRule> local_c8;
  undefined1 local_b0 [48];
  int local_80;
  undefined1 local_78 [48];
  int local_48;
  undefined1 local_40 [48];
  int local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_c8.d.ptr = (StyleRule *)&DAT_aaaaaaaaaaaaaaaa;
  local_c8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QCss::StyleRule>::QList((QList<QCss::StyleRule> *)0xa379b9);
  local_150 = 0;
  do {
    qVar2 = QList<QCss::StyleRule>::size(in_RDI);
    if (qVar2 <= local_150) {
      QList<QCss::StyleRule>::operator=
                (&local_c8,(QList<QCss::StyleRule> *)in_stack_fffffffffffffe58);
      QList<QCss::StyleRule>::~QList((QList<QCss::StyleRule> *)0xa37e0a);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return;
    }
    this_00 = QList<QCss::StyleRule>::at
                        ((QList<QCss::StyleRule> *)in_stack_fffffffffffffe60,
                         (qsizetype)in_stack_fffffffffffffe58);
    QList<QCss::Selector>::QList((QList<QCss::Selector> *)0xa37a43);
    for (local_15c = 0; qVar2 = QList<QCss::Selector>::size(&this_00->selectors), local_15c < qVar2;
        local_15c = local_15c + 1) {
      this_01 = (QMultiHash<QString,_QCss::StyleRule> *)
                QList<QCss::Selector>::at
                          (&in_stack_fffffffffffffe60->selectors,
                           (qsizetype)in_stack_fffffffffffffe58);
      bVar1 = QList<QCss::BasicSelector>::isEmpty((QList<QCss::BasicSelector> *)0xa37a9d);
      if (!bVar1) {
        pBVar3 = QList<QCss::BasicSelector>::at
                           ((QList<QCss::BasicSelector> *)in_stack_fffffffffffffe60,
                            (qsizetype)in_stack_fffffffffffffe58);
        if (pBVar3->relationToNext == NoRelation) {
          qVar2 = QList<QCss::BasicSelector>::size((QList<QCss::BasicSelector> *)this_01);
          if (qVar2 == 1) {
LAB_00a37aea:
            QList<QCss::BasicSelector>::size((QList<QCss::BasicSelector> *)this_01);
            QList<QCss::BasicSelector>::at
                      ((QList<QCss::BasicSelector> *)in_stack_fffffffffffffe60,
                       (qsizetype)in_stack_fffffffffffffe58);
            bVar1 = QList<QString>::isEmpty((QList<QString> *)0xa37b31);
            if (bVar1) {
              bVar1 = QString::isEmpty((QString *)0xa37bef);
              if (bVar1) {
                QList<QCss::Selector>::operator+=
                          (&in_stack_fffffffffffffe60->selectors,
                           (parameter_type)in_stack_fffffffffffffe58);
              }
              else {
                memset(local_78,0xaa,0x38);
                StyleRule::StyleRule(in_stack_fffffffffffffe60);
                QList<QCss::Selector>::operator+=
                          (&in_stack_fffffffffffffe60->selectors,
                           (parameter_type)in_stack_fffffffffffffe58);
                QList<QCss::Declaration>::operator=
                          ((QList<QCss::Declaration> *)in_stack_fffffffffffffe60,
                           (QList<QCss::Declaration> *)in_stack_fffffffffffffe58);
                local_48 = local_150;
                QString::QString((QString *)in_stack_fffffffffffffe60,
                                 (QString *)in_stack_fffffffffffffe58);
                if (in_ESI == 0) {
                  QString::toLower((QString *)in_stack_fffffffffffffe58);
                  QString::operator=((QString *)in_stack_fffffffffffffe60,
                                     (QString *)in_stack_fffffffffffffe58);
                  QString::~QString((QString *)0xa37ccf);
                }
                QMultiHash<QString,_QCss::StyleRule>::insert
                          (this_01,(QString *)in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
                QString::~QString((QString *)0xa37d02);
                StyleRule::~StyleRule(in_stack_fffffffffffffe60);
              }
            }
            else {
              memset(local_40,0xaa,0x38);
              StyleRule::StyleRule(in_stack_fffffffffffffe60);
              QList<QCss::Selector>::operator+=
                        (&in_stack_fffffffffffffe60->selectors,
                         (parameter_type)in_stack_fffffffffffffe58);
              QList<QCss::Declaration>::operator=
                        ((QList<QCss::Declaration> *)in_stack_fffffffffffffe60,
                         (QList<QCss::Declaration> *)in_stack_fffffffffffffe58);
              local_10 = local_150;
              in_stack_fffffffffffffe68 = in_RDI + 6;
              QList<QString>::at((QList<QString> *)in_stack_fffffffffffffe60,
                                 (qsizetype)in_stack_fffffffffffffe58);
              QMultiHash<QString,_QCss::StyleRule>::insert
                        (this_01,(QString *)in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
              StyleRule::~StyleRule(in_stack_fffffffffffffe60);
            }
          }
        }
        else {
          qVar2 = QList<QCss::BasicSelector>::size((QList<QCss::BasicSelector> *)this_01);
          if (1 < qVar2) goto LAB_00a37aea;
        }
      }
    }
    bVar1 = QList<QCss::Selector>::isEmpty((QList<QCss::Selector> *)0xa37d44);
    if (!bVar1) {
      memset(local_b0,0xaa,0x38);
      StyleRule::StyleRule(in_stack_fffffffffffffe60);
      QList<QCss::Selector>::operator=
                (&in_stack_fffffffffffffe60->selectors,&in_stack_fffffffffffffe58->selectors);
      QList<QCss::Declaration>::operator=
                ((QList<QCss::Declaration> *)in_stack_fffffffffffffe60,
                 (QList<QCss::Declaration> *)in_stack_fffffffffffffe58);
      local_80 = local_150;
      QList<QCss::StyleRule>::operator<<
                ((QList<QCss::StyleRule> *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      StyleRule::~StyleRule(in_stack_fffffffffffffe60);
    }
    QList<QCss::Selector>::~QList((QList<QCss::Selector> *)0xa37dd9);
    local_150 = local_150 + 1;
  } while( true );
}

Assistant:

void StyleSheet::buildIndexes(Qt::CaseSensitivity nameCaseSensitivity)
{
    QList<StyleRule> universals;
    for (int i = 0; i < styleRules.size(); ++i) {
        const StyleRule &rule = styleRules.at(i);
        QList<Selector> universalsSelectors;
        for (int j = 0; j < rule.selectors.size(); ++j) {
            const Selector& selector = rule.selectors.at(j);

            if (selector.basicSelectors.isEmpty())
                continue;

            if (selector.basicSelectors.at(0).relationToNext == BasicSelector::NoRelation) {
                if (selector.basicSelectors.size() != 1)
                    continue;
            } else if (selector.basicSelectors.size() <= 1) {
                continue;
            }

            const BasicSelector &sel = selector.basicSelectors.at(selector.basicSelectors.size() - 1);

            if (!sel.ids.isEmpty()) {
                StyleRule nr;
                nr.selectors += selector;
                nr.declarations = rule.declarations;
                nr.order = i;
                idIndex.insert(sel.ids.at(0), nr);
            } else if (!sel.elementName.isEmpty()) {
                StyleRule nr;
                nr.selectors += selector;
                nr.declarations = rule.declarations;
                nr.order = i;
                QString name = sel.elementName;
                if (nameCaseSensitivity == Qt::CaseInsensitive)
                    name = std::move(name).toLower();
                nameIndex.insert(name, nr);
            } else {
                universalsSelectors += selector;
            }
        }
        if (!universalsSelectors.isEmpty()) {
            StyleRule nr;
            nr.selectors = universalsSelectors;
            nr.declarations = rule.declarations;
            nr.order = i;
            universals << nr;
        }
    }
    styleRules = universals;
}